

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O2

void __thiscall ON_CompressedBuffer::Destroy(ON_CompressedBuffer *this)

{
  if (this->m_buffer_compressed != (void *)0x0) {
    onfree(this->m_buffer_compressed);
  }
  this->m_buffer_compressed_capacity = 0;
  this->m_buffer_compressed = (void *)0x0;
  this->m_crc_uncompressed = 0;
  this->m_crc_compressed = 0;
  this->m_method = 0;
  this->m_sizeof_element = 0;
  this->m_sizeof_uncompressed = 0;
  this->m_sizeof_compressed = 0;
  return;
}

Assistant:

void ON_CompressedBuffer::Destroy()
{
  if ( m_buffer_compressed )
    onfree(m_buffer_compressed);

  m_sizeof_uncompressed = 0;
  m_sizeof_compressed   = 0;
  m_crc_uncompressed    = 0;
  m_crc_compressed      = 0;
  m_method              = 0;
  m_sizeof_element      = 0;
  m_buffer_compressed   = 0;
  m_buffer_compressed_capacity = 0;
}